

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O1

void __thiscall avro::json::JsonGenerator::escapeCtl(JsonGenerator *this,char c)

{
  uint8_t *puVar1;
  byte *pbVar2;
  uint8_t uVar3;
  byte bVar4;
  
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  puVar1 = (this->out_).next_;
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = '\\';
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  puVar1 = (this->out_).next_;
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = 'U';
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  puVar1 = (this->out_).next_;
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = '0';
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  puVar1 = (this->out_).next_;
  (this->out_).next_ = puVar1 + 1;
  bVar4 = ((byte)c >> 4) + 0x57;
  if ((byte)c < 0xa0) {
    bVar4 = (byte)c >> 4 | 0x30;
  }
  *puVar1 = '0';
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  pbVar2 = (this->out_).next_;
  (this->out_).next_ = pbVar2 + 1;
  *pbVar2 = bVar4;
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  bVar4 = c & 0xf;
  uVar3 = bVar4 + 0x57;
  if (bVar4 < 10) {
    uVar3 = bVar4 + 0x30;
  }
  puVar1 = (this->out_).next_;
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = uVar3;
  return;
}

Assistant:

void escapeCtl(char c) {
        out_.write('\\');
        out_.write('U');
        out_.write('0');
        out_.write('0');
        out_.write(toHex((static_cast<unsigned char>(c)) / 16));
        out_.write(toHex((static_cast<unsigned char>(c)) % 16));
    }